

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svsetbase.h
# Opt level: O3

SVectorBase<double> * __thiscall
soplex::SVSetBase<double>::create(SVSetBase<double> *this,int idxmax)

{
  DLPSV *pDVar1;
  uint uVar2;
  DLPSV *pDVar3;
  uint n;
  DataKey local_18;
  
  uVar2 = 0;
  if (0 < idxmax) {
    uVar2 = idxmax;
  }
  n = uVar2;
  if ((this->super_ClassArray<soplex::Nonzero<double>_>).thesize == 0) {
    n = 1;
  }
  if (0 < idxmax) {
    n = uVar2;
  }
  ensureMem(this,n,true);
  ClassArray<soplex::Nonzero<double>_>::reSize
            (&this->super_ClassArray<soplex::Nonzero<double>_>,
             (this->super_ClassArray<soplex::Nonzero<double>_>).thesize + n);
  ensurePSVec(this,1);
  local_18.info = 0;
  local_18.idx = -1;
  pDVar3 = ClassSet<soplex::SVSetBase<double>::DLPSV>::create(&this->set,&local_18);
  pDVar1 = (this->list).super_IsList<soplex::SVSetBase<double>::DLPSV>.the_last;
  if (pDVar1 == (DLPSV *)0x0) {
    (this->list).super_IsList<soplex::SVSetBase<double>::DLPSV>.the_first = pDVar3;
  }
  else {
    pDVar1->thenext = pDVar3;
    pDVar3->theprev = (this->list).super_IsList<soplex::SVSetBase<double>::DLPSV>.the_last;
  }
  (this->list).super_IsList<soplex::SVSetBase<double>::DLPSV>.the_last = pDVar3;
  (pDVar3->super_SVectorBase<double>).m_elem =
       (this->super_ClassArray<soplex::Nonzero<double>_>).data +
       ((long)(this->super_ClassArray<soplex::Nonzero<double>_>).thesize - (ulong)n);
  (pDVar3->super_SVectorBase<double>).memused = 0;
  (pDVar3->super_SVectorBase<double>).memsize = n;
  return &pDVar3->super_SVectorBase<double>;
}

Assistant:

SVectorBase<R>* create(int idxmax = 0)
   {
      DLPSV* ps;

      if(idxmax < 0)
         idxmax = 0;

      if(memSize() == 0 && idxmax <= 0)
         idxmax = 1;

      ensureMem(idxmax);

      // resize the data array
#ifndef NDEBUG
      Nonzero<R>* olddata = SVSetBaseArray::data;
      SVSetBaseArray::reSize(memSize() + idxmax);
      assert(olddata == SVSetBaseArray::data);
#else
      SVSetBaseArray::reSize(memSize() + idxmax);
#endif

      ensurePSVec(1);
      ps = set.create();
      list.append(ps);

      ps->setMem(idxmax, &SVSetBaseArray::last() - idxmax + 1);

      return ps;
   }